

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnFunction
          (BinaryReaderInterp *this,Index index,Index sig_index)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  FuncType *__x;
  Location loc_1;
  Location loc;
  Var local_70;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_70,sig_index,&loc_1);
  RVar2 = SharedValidator::OnFunction(&this->validator_,&loc,&local_70);
  Var::~Var(&local_70);
  if (RVar2.enum_ != Error) {
    pMVar1 = this->module_;
    __x = (pMVar1->func_types).
          super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
          _M_impl.super__Vector_impl_data._M_start + sig_index;
    FuncType::FuncType((FuncType *)&loc,__x);
    std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::
    emplace_back<wabt::interp::FuncDesc>(&pMVar1->funcs,(FuncDesc *)&loc);
    FuncDesc::~FuncDesc((FuncDesc *)&loc);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,__x);
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnFunction(Index index, Index sig_index) {
  CHECK_RESULT(
      validator_.OnFunction(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  module_.funcs.push_back(FuncDesc{func_type, {}, Istream::kInvalidOffset, {}});
  func_types_.push_back(func_type);
  return Result::Ok;
}